

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::ExpressionsAssignment2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsAssignment2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  long lVar1;
  string *__rhs;
  long lVar2;
  string *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string shader_body;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string shader_source;
  string variable_basenames [4];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shader_body,
             "    float a[2] = float[](1.0, 2.0);\n    float b[2][2] = float[][](float[](1.0, 2.0), float[](1.0, 2.0));\n    float c[2][2][2] = float[][][](float[][](float[](1.0, 2.0), float[](1.0, 2.0)),float[][](float[](1.0, 2.0), float[](1.0, 2.0)));\n    float d[2][2][2][2] = float[][][][](float[][][](float[][](float[](1.0, 2.0), float[](1.0, 2.0)), float[][](float[](1.0, 2.0), float[](1.0, 2.0))),float[][][](float[][](float[](1.0, 2.0), float[](1.0, 2.0)), float[][](float[](1.0, 2.0), float[](1.0, 2.0))));\n\n"
             ,(allocator<char> *)variable_basenames);
  local_178 = variable_basenames;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_178,"a",(allocator<char> *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames + 1),"b",(allocator<char> *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames + 2),"c",(allocator<char> *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames + 3),"d",(allocator<char> *)&local_158);
  lVar2 = 0;
  do {
    if (lVar2 == 4) {
      lVar2 = 0x60;
      do {
        std::__cxx11::string::~string
                  ((string *)((long)&variable_basenames[0]._M_dataplus._M_p + lVar2));
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -0x20);
      std::__cxx11::string::~string((string *)&shader_body);
      return;
    }
    lVar1 = 4;
    __rhs = local_178;
    while (lVar2 != lVar1) {
      std::operator+(&shader_source,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     shader_start_abi_cxx11_,&shader_body);
      if (lVar1 != 4) {
        std::operator+(&local_158,"    ",variable_basenames + lVar2);
        std::operator+(&local_138,&local_158," = ");
        std::operator+(&local_f8,&local_138,__rhs);
        std::__cxx11::string::append((string *)&shader_source);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::append((char *)&shader_source);
        if (tested_shader_type < SHADER_TYPE_LAST) {
          (*(code *)(&DAT_0171ba60 + *(int *)(&DAT_0171ba60 + (ulong)tested_shader_type * 4)))();
          return;
        }
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0xaef);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      std::__cxx11::string::~string((string *)&shader_source);
      __rhs = __rhs + 1;
      lVar1 = 3;
    }
    lVar2 = lVar2 + 1;
    local_178 = local_178 + 1;
  } while( true );
}

Assistant:

void ExpressionsAssignment2<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_body("    float a[2] = float[](1.0, 2.0);\n"
							"    float b[2][2] = float[][](float[](1.0, 2.0), float[](1.0, 2.0));\n"
							"    float c[2][2][2] = float[][][]("
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0)),"
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0)));\n"
							"    float d[2][2][2][2] = float[][][][]("
							"float[][][]("
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0)), "
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0))),"
							"float[][][]("
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0)), "
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0))));\n\n");

	std::string variable_basenames[] = { "a", "b", "c", "d" };
	int			number_of_elements   = sizeof(variable_basenames) / sizeof(variable_basenames[0]);

	for (int variable_index = 0; variable_index < number_of_elements; variable_index++)
	{
		for (int value_index = variable_index; value_index < number_of_elements; value_index++)
		{
			std::string shader_source = shader_start + shader_body;

			/* Avoid the situation when a variable is assign to itself. */
			if (variable_index != value_index)
			{
				shader_source += "    " + variable_basenames[variable_index] + " = " + variable_basenames[value_index];
				shader_source += ";\n";

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				this->execute_negative_test(tested_shader_type, shader_source);
			} /* if(variable_index != value_index) */
		}	 /* for (int value_index = variable_index; ...) */
	}		  /* for (int variable_index = 0; ...) */
}